

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_VD_boot_record(archive_write *a)

{
  int iVar1;
  uchar *puVar2;
  archive_write *in_RDI;
  uchar *bp;
  iso9660_conflict *iso9660;
  uchar *bp_00;
  
  bp_00 = (uchar *)in_RDI->format_data;
  puVar2 = wb_buffptr(in_RDI);
  puVar2 = puVar2 + -1;
  set_VD_bp(puVar2,VDT_BOOT_RECORD,'\x01');
  builtin_memcpy(puVar2 + 8,"EL TORITO SPECIFICATION",0x17);
  set_unused_field_bp(bp_00,(int)((ulong)puVar2 >> 0x20),(int)puVar2);
  set_unused_field_bp(bp_00,(int)((ulong)puVar2 >> 0x20),(int)puVar2);
  set_num_731(bp_00,(uint32_t)((ulong)puVar2 >> 0x20));
  set_unused_field_bp(bp_00,(int)((ulong)puVar2 >> 0x20),(int)puVar2);
  iVar1 = wb_consume(in_RDI,(size_t)bp_00);
  return iVar1;
}

Assistant:

static int
write_VD_boot_record(struct archive_write *a)
{
	struct iso9660 *iso9660;
	unsigned char *bp;

	iso9660 = a->format_data;
	bp = wb_buffptr(a) -1;
	/* Volume Descriptor Type */
	set_VD_bp(bp, VDT_BOOT_RECORD, 1);
	/* Boot System Identifier */
	memcpy(bp+8, "EL TORITO SPECIFICATION", 23);
	set_unused_field_bp(bp, 8+23, 39);
	/* Unused */
	set_unused_field_bp(bp, 40, 71);
	/* Absolute pointer to first sector of Boot Catalog */
	set_num_731(bp+72,
	    iso9660->el_torito.catalog->file->content.location);
	/* Unused */
	set_unused_field_bp(bp, 76, LOGICAL_BLOCK_SIZE);

	return (wb_consume(a, LOGICAL_BLOCK_SIZE));
}